

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::ArrayPtr<kj::ArrayPtr<int>>&>
          (String *__return_storage_ptr__,kj *this,ArrayPtr<kj::ArrayPtr<int>_> *params)

{
  ArrayPtr<kj::ArrayPtr<int>_> *this_00;
  ArrayPtr<kj::ArrayPtr<int>_> *value;
  Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> *params_00;
  Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_> local_50;
  kj *local_18;
  ArrayPtr<kj::ArrayPtr<int>_> *params_local;
  
  local_18 = this;
  params_local = (ArrayPtr<kj::ArrayPtr<int>_> *)__return_storage_ptr__;
  this_00 = fwd<kj::ArrayPtr<kj::ArrayPtr<int>>&>((ArrayPtr<kj::ArrayPtr<int>_> *)this);
  toCharSequence<kj::ArrayPtr<kj::ArrayPtr<int>>&>(&local_50,(kj *)this_00,value);
  _::concat<kj::_::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>>>>
            (__return_storage_ptr__,(_ *)&local_50,params_00);
  _::Delimited<kj::ArrayPtr<kj::ArrayPtr<int>_>_>::~Delimited(&local_50);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}